

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader.c
# Opt level: O0

ALLEGRO_SHADER_PLATFORM resolve_platform(ALLEGRO_SHADER_PLATFORM platform)

{
  uint uVar1;
  ALLEGRO_DISPLAY *display_00;
  ALLEGRO_SHADER_PLATFORM in_EDI;
  ALLEGRO_DISPLAY *display;
  undefined4 local_4;
  
  local_4 = in_EDI;
  if (in_EDI == ALLEGRO_SHADER_AUTO) {
    display_00 = al_get_current_display();
    uVar1 = al_get_display_flags(display_00);
    if ((uVar1 & 4) == 0) {
      local_4 = ALLEGRO_SHADER_HLSL;
    }
    else {
      local_4 = ALLEGRO_SHADER_GLSL;
    }
  }
  return local_4;
}

Assistant:

static ALLEGRO_SHADER_PLATFORM resolve_platform(ALLEGRO_SHADER_PLATFORM platform)
{
   if (platform == ALLEGRO_SHADER_AUTO) {
      ALLEGRO_DISPLAY *display = al_get_current_display();
      ASSERT(display);
      if (al_get_display_flags(display) & ALLEGRO_OPENGL) {
         platform = ALLEGRO_SHADER_GLSL;
      }
      else {
         platform = ALLEGRO_SHADER_HLSL;
      }
   }

   return platform;
}